

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O0

void Prs_ManReadVerilogTest(char *pFileName)

{
  uint uVar1;
  int iVar2;
  abctime aVar3;
  Vec_Ptr_t *p;
  Abc_Nam_t *p_00;
  abctime aVar4;
  char *pFileName_00;
  Vec_Ptr_t *vPrs;
  abctime clk;
  char *pFileName_local;
  
  aVar3 = Abc_Clock();
  p = Prs_ManReadVerilog(pFileName);
  if (p != (Vec_Ptr_t *)0x0) {
    uVar1 = Vec_PtrSize(p);
    printf("Finished reading %d networks. ",(ulong)uVar1);
    p_00 = Prs_ManNameMan(p);
    uVar1 = Abc_NamObjNumMax(p_00);
    printf("NameIDs = %d. ",(ulong)uVar1);
    iVar2 = Prs_ManMemory(p);
    printf("Memory = %.2f MB. ",((double)iVar2 * 1.0) / 1048576.0);
    aVar4 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar4 - aVar3);
    pFileName_00 = Extra_FileNameGenericAppend(pFileName,"_out.v");
    Prs_ManWriteVerilog(pFileName_00,p);
    Prs_ManVecFree(p);
  }
  return;
}

Assistant:

void Prs_ManReadVerilogTest( char * pFileName )
{
    abctime clk = Abc_Clock();
    Vec_Ptr_t * vPrs = Prs_ManReadVerilog( pFileName );
    if ( !vPrs ) return;
    printf( "Finished reading %d networks. ", Vec_PtrSize(vPrs) );
    printf( "NameIDs = %d. ", Abc_NamObjNumMax(Prs_ManNameMan(vPrs)) );
    printf( "Memory = %.2f MB. ", 1.0*Prs_ManMemory(vPrs)/(1<<20) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Prs_ManWriteVerilog( Extra_FileNameGenericAppend(pFileName, "_out.v"), vPrs );
//    Abc_NamPrint( Prs_ManNameMan(vPrs) );
    Prs_ManVecFree( vPrs );
}